

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O0

void cuddLocalCacheClearAll(DdManager *manager)

{
  DdLocalCache *local_18;
  DdLocalCache *cache;
  DdManager *manager_local;
  
  for (local_18 = manager->localCaches; local_18 != (DdLocalCache *)0x0; local_18 = local_18->next)
  {
    memset(local_18->item,0,(ulong)(local_18->slots * local_18->itemsize));
  }
  return;
}

Assistant:

void
cuddLocalCacheClearAll(
  DdManager * manager)
{
    DdLocalCache *cache = manager->localCaches;

    while (cache != NULL) {
        memset(cache->item, 0, (size_t)(cache->slots * cache->itemsize));
        cache = cache->next;
    }
    return;

}